

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall
QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::data
          (QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *this)

{
  QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *this_00;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *ppVar1;
  QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *in_RDI;
  
  detach((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x2f671c);
  this_00 = (QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
            QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::operator->
                      (in_RDI);
  ppVar1 = QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::data(this_00);
  return ppVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }